

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

void __thiscall IrSim::optimizeAssign(IrSim *this)

{
  int iVar1;
  __type _Var2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  char *pcVar7;
  Operand *__lhs;
  long in_RDI;
  int active;
  int n;
  string right;
  string val;
  int m;
  int kind;
  int j;
  int k;
  int i;
  int size;
  Operand *in_stack_ffffffffffffff48;
  int i_00;
  InterCode *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  Operand *in_stack_ffffffffffffff60;
  IrSim *in_stack_ffffffffffffff68;
  int local_70;
  InterCode *in_stack_ffffffffffffff98;
  string local_60 [32];
  string local_40 [32];
  int local_20;
  int local_1c;
  int local_18;
  value_type local_14;
  int local_10;
  int local_c;
  
  *(undefined1 *)(in_RDI + 0x1f8) = 0;
  sVar4 = std::
          vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
          ::size((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *)(in_RDI + 0x138));
  local_c = (int)sVar4;
  local_10 = 0;
  do {
    if (local_c <= local_10) {
      return;
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf0),(long)local_10);
    local_14 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf0),(long)(local_10 + 1));
    local_18 = *pvVar5 + -1;
    for (; local_14 <= local_18; local_14 = local_14 + 1) {
      pvVar6 = std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                         ((vector<InterCode,_std::allocator<InterCode>_> *)(in_RDI + 0x80),
                          (long)local_14);
      local_1c = pvVar6->kind;
      if (local_1c == 5) {
        pvVar6 = std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                           ((vector<InterCode,_std::allocator<InterCode>_> *)(in_RDI + 0x80),
                            (long)local_14);
        local_20 = (pvVar6->target).active;
        pvVar6 = std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                           ((vector<InterCode,_std::allocator<InterCode>_> *)(in_RDI + 0x80),
                            (long)local_14);
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&(pvVar6->target).value);
        if (*pcVar7 == 'v') {
          local_20 = -1;
        }
        if (0 < local_20) {
          pvVar6 = std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                             ((vector<InterCode,_std::allocator<InterCode>_> *)(in_RDI + 0x80),
                              (long)local_14);
          std::__cxx11::string::string(local_40,(string *)&(pvVar6->target).value);
          pvVar6 = std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                             ((vector<InterCode,_std::allocator<InterCode>_> *)(in_RDI + 0x80),
                              (long)local_14);
          std::__cxx11::string::string(local_60,(string *)&(pvVar6->arg1).value);
          pvVar6 = std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                             ((vector<InterCode,_std::allocator<InterCode>_> *)(in_RDI + 0x80),
                              (long)local_14);
          local_1c = (pvVar6->arg1).kind;
          while (0 < local_20) {
            for (local_70 = 0; local_70 < 3; local_70 = local_70 + 1) {
              std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                        ((vector<InterCode,_std::allocator<InterCode>_> *)(in_RDI + 0x80),
                         (long)local_20);
              i_00 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
              __lhs = InterCode::operator[](in_stack_ffffffffffffff50,i_00);
              _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs,&in_stack_ffffffffffffff68->tmpVarPrefix);
              if (_Var2) {
                *(undefined1 *)(in_RDI + 0x1f8) = 1;
                std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                          ((vector<InterCode,_std::allocator<InterCode>_> *)(in_RDI + 0x80),
                           (long)local_20);
                in_stack_ffffffffffffff68 =
                     (IrSim *)InterCode::operator[](in_stack_ffffffffffffff50,i_00);
                std::__cxx11::string::operator=
                          ((string *)&in_stack_ffffffffffffff68->field_0x8,local_60);
                in_stack_ffffffffffffff5c = local_1c;
                std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                          ((vector<InterCode,_std::allocator<InterCode>_> *)(in_RDI + 0x80),
                           (long)local_20);
                in_stack_ffffffffffffff60 = InterCode::operator[](in_stack_ffffffffffffff50,i_00);
                in_stack_ffffffffffffff60->kind = in_stack_ffffffffffffff5c;
                std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                          ((vector<InterCode,_std::allocator<InterCode>_> *)(in_RDI + 0x80),
                           (long)local_20);
                in_stack_ffffffffffffff50 =
                     (InterCode *)InterCode::operator[](in_stack_ffffffffffffff50,i_00);
                iVar1 = *(int *)&(in_stack_ffffffffffffff50->target).field_0x20;
                std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                          ((vector<InterCode,_std::allocator<InterCode>_> *)(in_RDI + 0x80),
                           (long)local_20);
                InterCode::doArith(in_stack_ffffffffffffff98);
                local_20 = iVar1;
                std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                          ((vector<InterCode,_std::allocator<InterCode>_> *)(in_RDI + 0x80),
                           (long)iVar1);
                in_stack_ffffffffffffff48 = InterCode::operator[](in_stack_ffffffffffffff50,i_00);
                in_stack_ffffffffffffff48->active = 0;
                break;
              }
            }
            if (local_70 == 3) {
              local_20 = -1;
            }
          }
          std::__cxx11::string::~string(local_60);
          std::__cxx11::string::~string(local_40);
        }
        if (local_20 == 0) {
          std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                    ((vector<InterCode,_std::allocator<InterCode>_> *)(in_RDI + 0x80),(long)local_14
                    );
          bVar3 = canDisable(in_stack_ffffffffffffff68,(string *)in_stack_ffffffffffffff60,
                             in_stack_ffffffffffffff5c);
          if (bVar3) {
            std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                      ((vector<InterCode,_std::allocator<InterCode>_> *)(in_RDI + 0x80),
                       (long)local_14);
            InterCode::disable(in_stack_ffffffffffffff50);
            *(undefined1 *)(in_RDI + 0x1f8) = 1;
          }
        }
      }
      else if ((0 < local_1c) && (local_1c < 6)) {
        std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                  ((vector<InterCode,_std::allocator<InterCode>_> *)(in_RDI + 0x80),(long)local_14);
        bVar3 = InterCode::doArith(in_stack_ffffffffffffff98);
        if (bVar3) {
          *(undefined1 *)(in_RDI + 0x1f8) = 1;
        }
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

void IrSim::optimizeAssign() {
    isOpted = false;
    int size = (int)edges.size();
    for (int i = 0; i < size; ++i) {
        for (int k = (int) basicBlocks[i], j = (int) basicBlocks[i + 1] - 1; k <= j; ++k) {
            int kind = irList[k].kind;
            if (kind == IC_ASSIGN) {
                int m = irList[k].target.active;
                if (irList[k].target.value[0] == 'v')
                    m = -1;
                if (m > 0) {
                    string val = irList[k].target.value;
                    string right = irList[k].arg1.value;
                    kind = irList[k].arg1.kind;
                    while (m > 0) {
                        int n = 0;
                        for (; n < 3; ++n) {
                            if (irList[m][n].value == val) {
                                isOpted = true;
                                irList[m][n].value = right;
                                irList[m][n].kind = kind;
                                int active = irList[m][n].active;
                                irList[m].doArith();
                                m = active;
                                irList[m][n].active = 0;
                                break;
                            }
                        }
                        if (n == 3) {
//                            cerr << "debug: index val != val (should not happen, ignore optimizing)" << endl;
                            m = -1;
                        }
                    }
                }
//                else if (irList[k].target.active != 0 && irList[k].target.value[0] != 'v') {
//                    cerr << "debug: target < 0 (should not happen, ignore optimizing)" << endl;
//                }
                if (m == 0 && canDisable(irList[k].target.value, i)) {
                    irList[k].disable();
                    isOpted = true;
                }
            }
            else if (kind >= IC_ADD && kind <= IC_ASSIGN) {
                if (irList[k].doArith())
                    isOpted = true;
            }
        }
    }
}